

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCDouble.h
# Opt level: O2

HighsCDouble * __thiscall HighsCDouble::operator/=(HighsCDouble *this,double v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  HighsCDouble HVar3;
  HighsCDouble local_38;
  HighsCDouble local_28;
  
  auVar1._8_8_ = v;
  auVar1._0_8_ = v;
  local_28 = (HighsCDouble)divpd((undefined1  [16])*this,auVar1);
  local_38 = operator*(&local_28,v);
  HVar3 = operator-(&local_38,this);
  auVar2._8_8_ = v;
  auVar2._0_8_ = v;
  local_38 = (HighsCDouble)divpd((undefined1  [16])HVar3,auVar2);
  HVar3 = operator-(&local_28,&local_38);
  *this = HVar3;
  return this;
}

Assistant:

HighsCDouble& operator/=(double v) {
    HighsCDouble d(hi / v, lo / v);
    HighsCDouble c = d * v - (*this);
    c.hi /= v;
    c.lo /= v;
    *this = d - c;
    return *this;
  }